

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

string * __thiscall
pbrt::ParsedParameter::ToString_abi_cxx11_(string *__return_storage_ptr__,ParsedParameter *this)

{
  size_t sVar1;
  double *pdVar2;
  string *psVar3;
  double *in_RCX;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  size_t sVar5;
  allocator<char> local_fa;
  allocator<char> local_f9;
  string *local_f8;
  double d;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_f8 = __return_storage_ptr__;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"\"",&local_f9);
  std::operator+(&local_70,&local_90,&this->type);
  std::operator+(&local_50,&local_70," ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d,&local_50,
                 &this->name);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"\" [ ",&local_fa);
  std::operator+(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d,
                 &local_b0);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&d);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  psVar3 = local_f8;
  sVar1 = (this->numbers).nStored;
  if (sVar1 == 0) {
    sVar1 = (this->strings).nStored;
    if (sVar1 == 0) {
      sVar1 = (this->bools).nStored;
      if (sVar1 != 0) {
        for (sVar5 = 0; sVar1 != sVar5; sVar5 = sVar5 + 1) {
          std::__cxx11::string::append((char *)local_f8);
        }
      }
    }
    else {
      __rhs = (this->strings).ptr;
      for (lVar4 = sVar1 << 5; lVar4 != 0; lVar4 = lVar4 + -0x20) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d,'\"',
                       __rhs);
        std::operator+(&local_d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d,"\" "
                      );
        std::__cxx11::string::append((string *)psVar3);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&d);
        __rhs = __rhs + 1;
      }
    }
  }
  else {
    pdVar2 = (this->numbers).ptr;
    for (lVar4 = 0; sVar1 << 3 != lVar4; lVar4 = lVar4 + 8) {
      d = *(double *)((long)pdVar2 + lVar4);
      StringPrintf<double&>(&local_d0,(pbrt *)0x9e590e,(char *)&d,in_RCX);
      std::__cxx11::string::append((string *)local_f8);
      std::__cxx11::string::~string((string *)&local_d0);
    }
  }
  psVar3 = local_f8;
  std::__cxx11::string::append((char *)local_f8);
  return psVar3;
}

Assistant:

std::string ParsedParameter::ToString() const {
    std::string str;
    str += std::string("\"") + type + " " + name + std::string("\" [ ");
    if (!numbers.empty())
        for (double d : numbers)
            str += StringPrintf("%f ", d);
    else if (!strings.empty())
        for (const auto &s : strings)
            str += '\"' + s + "\" ";
    else if (!bools.empty())
        for (bool b : bools)
            str += b ? "true " : "false ";
    str += "] ";

    return str;
}